

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::native(Twine *path,SmallVectorImpl<char> *result,Style style)

{
  Child CVar1;
  bool bVar2;
  Twine *pTVar3;
  Child local_38 [2];
  Style local_24;
  SmallVectorTemplateCommon<char,_void> *pSStack_20;
  Style style_local;
  SmallVectorImpl<char> *result_local;
  Twine *path_local;
  
  local_24 = style;
  pSStack_20 = (SmallVectorTemplateCommon<char,_void> *)result;
  result_local = (SmallVectorImpl<char> *)path;
  bVar2 = Twine::isSingleStringRef(path);
  if (bVar2) {
    local_38 = (Child  [2])Twine::getSingleStringRef((Twine *)result_local);
    path_local = (Twine *)local_38;
    CVar1 = local_38[0];
    pTVar3 = (Twine *)SmallVectorTemplateCommon<char,_void>::data(pSStack_20);
    bVar2 = false;
    if (CVar1.twine == pTVar3) goto LAB_001f1c87;
  }
  bVar2 = true;
LAB_001f1c87:
  if (bVar2) {
    SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)pSStack_20);
    Twine::toVector((Twine *)result_local,(SmallVectorImpl<char> *)pSStack_20);
    native((SmallVectorImpl<char> *)pSStack_20,local_24);
    return;
  }
  __assert_fail("(!path.isSingleStringRef() || path.getSingleStringRef().data() != result.data()) && \"path and result are not allowed to overlap!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                ,0x21d,"void llvm::sys::path::native(const Twine &, SmallVectorImpl<char> &, Style)"
               );
}

Assistant:

void native(const Twine &path, SmallVectorImpl<char> &result, Style style) {
  assert((!path.isSingleStringRef() ||
          path.getSingleStringRef().data() != result.data()) &&
         "path and result are not allowed to overlap!");
  // Clear result.
  result.clear();
  path.toVector(result);
  native(result, style);
}